

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::makeMove(Board *this,size_t srcRow,size_t srcCol,size_t dstRow,size_t dstCol)

{
  reference __a;
  reference __b;
  size_t dstCol_local;
  size_t dstRow_local;
  size_t srcCol_local;
  size_t srcRow_local;
  Board *this_local;
  
  __a = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                  (&this->values,dstRow * this->sizeInt + dstCol);
  __b = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                  (&this->values,srcRow * this->sizeInt + srcCol);
  std::swap<unsigned_long>(__a,__b);
  return;
}

Assistant:

void Board::makeMove( size_t srcRow, size_t srcCol, size_t dstRow, size_t dstCol )
{
    std::swap( values.at( dstRow * sizeInt + dstCol ), values.at( srcRow * sizeInt + srcCol ));
}